

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O0

void __thiscall Book::printProperties(Book *this)

{
  ostream *poVar1;
  Book *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Book Author: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->author);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Book Publisher: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->publisher);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Book Page: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->page);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Book::printProperties() {
	cout << "Book Author: " << author << endl;
	cout << "Book Publisher: " << publisher << endl;
	cout << "Book Page: " << page << endl;
}